

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

void __thiscall
server::ctfservmode::initclient(ctfservmode *this,clientinfo *ci,packetbuf *p,bool connecting)

{
  int iVar1;
  flag *this_00;
  flag *f;
  int local_28;
  int i;
  int k;
  bool connecting_local;
  packetbuf *p_local;
  clientinfo *ci_local;
  ctfservmode *this_local;
  
  putint(p,0x56);
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    putint(p,this->scores[local_28]);
  }
  iVar1 = vector<server::ctfservmode::flag>::length(&this->flags);
  putint(p,iVar1);
  for (f._4_4_ = 0; iVar1 = vector<server::ctfservmode::flag>::length(&this->flags), f._4_4_ < iVar1
      ; f._4_4_ = f._4_4_ + 1) {
    this_00 = vector<server::ctfservmode::flag>::operator[](&this->flags,f._4_4_);
    putint(p,this_00->version);
    putint(p,this_00->spawnindex);
    putint(p,this_00->owner);
    putint(p,(uint)(this_00->invistime != 0));
    if ((this_00->owner < 0) && (putint(p,(uint)(this_00->droptime != 0)), this_00->droptime != 0))
    {
      putint(p,(int)((this_00->droploc).field_0.field_0.x * 16.0));
      putint(p,(int)((this_00->droploc).field_0.field_0.y * 16.0));
      putint(p,(int)((this_00->droploc).field_0.field_0.z * 16.0));
    }
    if (((-4 < gamemode) && (gamemode < 0x17)) &&
       ((gamemodes[gamemode + 3].flags & 0x500U) == 0x500)) {
      if ((this_00->team == 0) || (this_00->holdtime == 0)) {
        putint(p,-1);
      }
      else {
        putint(p,this_00->team);
        iVar1 = flag::holdcounter(this_00);
        putint(p,iVar1 / 100);
      }
    }
  }
  return;
}

Assistant:

void initclient(clientinfo *ci, packetbuf &p, bool connecting)
    {
        putint(p, N_INITFLAGS);
        loopk(2) putint(p, scores[k]);
        putint(p, flags.length());
        loopv(flags)
        {
            flag &f = flags[i];
            putint(p, f.version);
            putint(p, f.spawnindex);
            putint(p, f.owner);
            putint(p, f.invistime ? 1 : 0);
            if(f.owner<0)
            {
                putint(p, f.droptime ? 1 : 0);
                if(f.droptime)
                {
                    putint(p, int(f.droploc.x*DMF));
                    putint(p, int(f.droploc.y*DMF));
                    putint(p, int(f.droploc.z*DMF));
                }
            }
            if(m_hold)
            {
                if(!f.team || !f.holdtime) putint(p, -1);
                else
                {
                    putint(p, f.team);
                    putint(p, f.holdcounter() / 100);
                }
            }
        }
    }